

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O1

int GetSubRect(WebPPicture *prev_canvas,WebPPicture *curr_canvas,int is_key_frame,int is_first_frame
              ,int empty_rect_allowed,int is_lossless,float quality,FrameRectangle *rect,
              WebPPicture *sub_frame)

{
  int iVar1;
  uint top;
  uint left;
  int height;
  
  if (is_key_frame == 0 || is_first_frame != 0) {
    MinimizeChangeRectangle(prev_canvas,curr_canvas,rect,is_lossless,quality);
  }
  if ((rect->width == 0) || (rect->height == 0)) {
    if (empty_rect_allowed != 0) {
      return 1;
    }
    rect->width = 1;
    rect->height = 1;
  }
  iVar1 = (rect->x_offset & 1U) + rect->width;
  rect->width = iVar1;
  height = (rect->y_offset & 1U) + rect->height;
  rect->height = height;
  left = rect->x_offset & 0xfffffffe;
  rect->x_offset = left;
  top = rect->y_offset & 0xfffffffe;
  rect->y_offset = top;
  iVar1 = WebPPictureView(curr_canvas,left,top,iVar1,height,sub_frame);
  return iVar1;
}

Assistant:

static int GetSubRect(const WebPPicture* const prev_canvas,
                      const WebPPicture* const curr_canvas, int is_key_frame,
                      int is_first_frame, int empty_rect_allowed,
                      int is_lossless, float quality,
                      FrameRectangle* const rect,
                      WebPPicture* const sub_frame) {
  if (!is_key_frame || is_first_frame) {  // Optimize frame rectangle.
    // Note: This behaves as expected for first frame, as 'prev_canvas' is
    // initialized to a fully transparent canvas in the beginning.
    MinimizeChangeRectangle(prev_canvas, curr_canvas, rect,
                            is_lossless, quality);
  }

  if (IsEmptyRect(rect)) {
    if (empty_rect_allowed) {  // No need to get 'sub_frame'.
      return 1;
    } else {                   // Force a 1x1 rectangle.
      rect->width = 1;
      rect->height = 1;
      assert(rect->x_offset == 0);
      assert(rect->y_offset == 0);
    }
  }

  SnapToEvenOffsets(rect);
  return WebPPictureView(curr_canvas, rect->x_offset, rect->y_offset,
                         rect->width, rect->height, sub_frame);
}